

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O1

int bip39_mnemonic_to_bytes(words *w,char *mnemonic,uchar *bytes_out,size_t len,size_t *written)

{
  ulong uVar1;
  int iVar2;
  words *w_00;
  uchar tmp_bytes [42];
  size_t local_a0 [3];
  uchar local_88 [88];
  
  w_00 = &en_words;
  if (w != (words *)0x0) {
    w_00 = w;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if (((bytes_out != (uchar *)0x0) && (mnemonic != (char *)0x0)) && (w_00->bits == 0xb)) {
    iVar2 = mnemonic_to_bytes(w_00,mnemonic,local_88,0x2a,local_a0);
    if (iVar2 == 0) {
      uVar1 = local_a0[0] - 1;
      local_a0[0] = local_a0[0] - 2;
      if (uVar1 < 0x21) {
        local_a0[0] = uVar1;
      }
      iVar2 = -2;
      if ((local_a0[0] < 0x2b) && (iVar2 = 0, local_a0[0] <= len)) {
        uVar1 = local_a0[0] - 0x10 >> 2;
        if ((local_a0[0] << 0x3e | uVar1) < 7) {
          iVar2 = (*(code *)(&DAT_00636b9c + *(int *)(&DAT_00636b9c + uVar1 * 4)))();
          return iVar2;
        }
        local_a0[0] = 0;
        iVar2 = -2;
      }
    }
    wally_clear(local_88,0x2a);
    if (iVar2 == 0 && written != (size_t *)0x0) {
      *written = local_a0[0];
    }
  }
  return iVar2;
}

Assistant:

int bip39_mnemonic_to_bytes(const struct words *w, const char *mnemonic,
                            unsigned char *bytes_out, size_t len,
                            size_t *written)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t mask, tmp_len;
    int ret;

    /* Ideally we would infer the wordlist here. Unfortunately this cannot
     * work reliably because the default word lists overlap. In combination
     * with being sorted lexographically, this means the default lists
     * were poorly chosen. But we are stuck with them now.
     *
     * If the caller doesn't know which word list to use, they should iterate
     * over the available ones and try any resulting list that the mnemonic
     * validates against.
     */
    w = w ? w : &en_words;

    if (written)
        *written = 0;

    if (w->bits != 11u || !mnemonic || !bytes_out)
        return WALLY_EINVAL;

    ret = mnemonic_to_bytes(w, mnemonic, tmp_bytes, sizeof(tmp_bytes), &tmp_len);

    if (!ret) {
        /* Remove checksum bytes from the output length */
        --tmp_len;
        if (tmp_len > BIP39_ENTROPY_LEN_256)
            --tmp_len; /* Second byte required */

        if (tmp_len > sizeof(tmp_bytes))
            ret = WALLY_EINVAL; /* Too big for biggest supported entropy */
        else {
            if (tmp_len <= len) {
                if (!(mask = len_to_mask(tmp_len)) ||
                    !checksum_ok(tmp_bytes, tmp_len, mask)) {
                    tmp_len = 0;
                    ret = WALLY_EINVAL; /* Bad checksum */
                }
                else
                    memcpy(bytes_out, tmp_bytes, tmp_len);
            }
        }
    }

    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    if (!ret && written)
        *written = tmp_len;
    return ret;
}